

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_table_object(flatcc_json_printer_t *ctx,void *p,int ttl,flatcc_json_printer_table_f *pf)

{
  char *pcVar1;
  flatbuffers_voffset_t fVar2;
  flatbuffers_soffset_t fVar3;
  void *local_48;
  flatcc_json_printer_table_descriptor_t td;
  flatcc_json_printer_table_f *pf_local;
  int ttl_local;
  void *p_local;
  flatcc_json_printer_t *ctx_local;
  
  td.vtable._4_4_ = ttl + -1;
  td._24_8_ = pf;
  if (td.vtable._4_4_ == 0) {
    flatcc_json_printer_set_error(ctx,2);
  }
  else {
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '{';
    td.vsize = 0;
    local_48 = p;
    fVar3 = __flatbuffers_soffset_read_from_pe(p);
    td.table = (void *)((long)p - (long)fVar3);
    fVar2 = __flatbuffers_voffset_read_from_pe(td.table);
    td.vtable._0_4_ = (uint)fVar2;
    (*(code *)td._24_8_)(ctx,&local_48);
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '}';
  }
  return;
}

Assistant:

static inline void print_table_object(flatcc_json_printer_t *ctx,
        const void *p, int ttl, flatcc_json_printer_table_f pf)
{
    flatcc_json_printer_table_descriptor_t td;

    if (!--ttl) {
        flatcc_json_printer_set_error(ctx, flatcc_json_printer_error_deep_recursion);
        return;
    }
    print_start('{');
    td.count = 0;
    td.ttl = ttl;
    td.table = p;
    td.vtable = (uint8_t *)p - __flatbuffers_soffset_read_from_pe(p);
    td.vsize = __flatbuffers_voffset_read_from_pe(td.vtable);
    pf(ctx, &td);
    print_end('}');
}